

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIImage::setImage(CGUIImage *this,ITexture *image)

{
  ITexture *pIVar1;
  
  pIVar1 = this->Texture;
  if (pIVar1 != image) {
    if (pIVar1 != (ITexture *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar1->_vptr_ITexture + (long)pIVar1->_vptr_ITexture[-3]));
    }
    this->Texture = image;
    if (image != (ITexture *)0x0) {
      *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) =
           *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) + 1;
    }
  }
  return;
}

Assistant:

void CGUIImage::setImage(video::ITexture *image)
{
	if (image == Texture)
		return;

	if (Texture)
		Texture->drop();

	Texture = image;

	if (Texture)
		Texture->grab();
}